

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

int __thiscall ImFontAtlas::AddCustomRectRegular(ImFontAtlas *this,int width,int height)

{
  int iVar1;
  ImFontAtlasCustomRect *pIVar2;
  ulong uVar3;
  ImFontAtlasCustomRect *pIVar4;
  int iVar5;
  int iVar6;
  
  iVar6 = (this->CustomRects).Size;
  iVar1 = (this->CustomRects).Capacity;
  if (iVar6 == iVar1) {
    iVar6 = iVar6 + 1;
    if (iVar1 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar1 / 2 + iVar1;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar1 < iVar6) {
      pIVar4 = (ImFontAtlasCustomRect *)ImGui::MemAlloc((long)iVar6 << 5);
      pIVar2 = (this->CustomRects).Data;
      if (pIVar2 != (ImFontAtlasCustomRect *)0x0) {
        memcpy(pIVar4,pIVar2,(long)(this->CustomRects).Size << 5);
        ImGui::MemFree((this->CustomRects).Data);
      }
      (this->CustomRects).Data = pIVar4;
      (this->CustomRects).Capacity = iVar6;
    }
  }
  uVar3 = (ulong)(uint)width & 0xffffffff0000ffff | (ulong)(ushort)height << 0x10 |
          0xffffffff00000000;
  pIVar4 = (this->CustomRects).Data;
  iVar6 = (this->CustomRects).Size;
  pIVar2 = pIVar4 + iVar6;
  pIVar2->Width = (short)uVar3;
  pIVar2->Height = (short)(uVar3 >> 0x10);
  pIVar2->X = (short)(uVar3 >> 0x20);
  pIVar2->Y = (short)(uVar3 >> 0x30);
  pIVar4[iVar6].GlyphID = 0;
  pIVar4[iVar6].GlyphAdvanceX = 0.0;
  pIVar4 = pIVar4 + iVar6;
  (pIVar4->GlyphOffset).x = 0.0;
  (pIVar4->GlyphOffset).y = 0.0;
  pIVar4->Font = (ImFont *)0x0;
  iVar6 = (this->CustomRects).Size;
  (this->CustomRects).Size = iVar6 + 1;
  return iVar6;
}

Assistant:

int ImFontAtlas::AddCustomRectRegular(int width, int height)
{
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    ImFontAtlasCustomRect r;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}